

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O0

void SGP4::DeepSpacePeriodics
               (double tsince,DeepSpaceConstants *ds_constants,double *em,double *xinc,
               double *omgasm,double *xnodes,double *xll)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double oldxnodes;
  double dls;
  double xls;
  double dbet;
  double dalf;
  double betdp;
  double alfdp;
  double cosok;
  double sinok;
  double cosis;
  double sinis;
  double ph;
  double pgh;
  double pl;
  double pinc;
  double pe;
  double shl;
  double sghl;
  double sll;
  double sil;
  double sel;
  double shs;
  double sghs;
  double sls;
  double sis;
  double ses;
  double f3;
  double f2;
  double sinzf;
  double zf;
  double zm;
  double *xll_local;
  double *xnodes_local;
  double *omgasm_local;
  double *xinc_local;
  double *em_local;
  DeepSpaceConstants *ds_constants_local;
  double tsince_local;
  
  dVar5 = tsince * 1.19459e-05 + ds_constants->zmos;
  dVar6 = sin(dVar5);
  dVar5 = dVar6 * 0.0335 + dVar5;
  dVar7 = sin(dVar5);
  dVar8 = dVar7 * 0.5 * dVar7 + -0.25;
  dVar9 = cos(dVar5);
  dVar9 = dVar7 * -0.5 * dVar9;
  dVar6 = ds_constants->se2;
  dVar5 = ds_constants->se3;
  dVar15 = ds_constants->si2;
  dVar16 = ds_constants->si3;
  dVar17 = ds_constants->sl2;
  dVar18 = ds_constants->sl3;
  dVar20 = ds_constants->sl4;
  dVar1 = ds_constants->sgh2;
  dVar2 = ds_constants->sgh3;
  dVar3 = ds_constants->sgh4;
  dVar4 = ds_constants->sh2;
  dVar19 = ds_constants->sh3;
  dVar10 = tsince * 0.00015835218 + ds_constants->zmol;
  dVar11 = sin(dVar10);
  dVar10 = dVar11 * 0.1098 + dVar10;
  dVar12 = sin(dVar10);
  dVar13 = dVar12 * 0.5 * dVar12 + -0.25;
  dVar14 = cos(dVar10);
  dVar14 = dVar12 * -0.5 * dVar14;
  dVar11 = ds_constants->ee2;
  dVar10 = ds_constants->e3;
  dVar15 = dVar15 * dVar8 + dVar16 * dVar9 + ds_constants->xi2 * dVar13 + ds_constants->xi3 * dVar14
  ;
  dVar16 = dVar20 * dVar7 + dVar17 * dVar8 + dVar18 * dVar9 +
           ds_constants->xl4 * dVar12 + ds_constants->xl2 * dVar13 + ds_constants->xl3 * dVar14;
  dVar17 = dVar3 * dVar7 + dVar1 * dVar8 + dVar2 * dVar9 +
           ds_constants->xgh4 * dVar12 + ds_constants->xgh2 * dVar13 + ds_constants->xgh3 * dVar14;
  dVar18 = dVar4 * dVar8 + dVar19 * dVar9 + ds_constants->xh2 * dVar13 + ds_constants->xh3 * dVar14;
  *xinc = dVar15 + *xinc;
  *em = dVar6 * dVar8 + dVar5 * dVar9 + dVar11 * dVar13 + dVar10 * dVar14 + *em;
  dVar6 = sin(*xinc);
  dVar5 = cos(*xinc);
  if (*xinc < 0.2) {
    dVar19 = sin(*xnodes);
    dVar11 = cos(*xnodes);
    dVar20 = Util::WrapTwoPI(*xnodes);
    *xnodes = dVar20;
    dVar20 = *xll;
    dVar1 = *omgasm;
    dVar2 = *xnodes;
    dVar3 = *xnodes;
    dVar4 = *xnodes;
    dVar18 = atan2(dVar18 * dVar11 + dVar15 * dVar5 * dVar19 + dVar6 * dVar19,
                   -dVar18 * dVar19 + dVar15 * dVar5 * dVar11 + dVar6 * dVar11);
    *xnodes = dVar18;
    if (3.141592653589793 < ABS(dVar4 - *xnodes)) {
      if (dVar4 <= *xnodes) {
        *xnodes = *xnodes - 6.283185307179586;
      }
      else {
        *xnodes = *xnodes + 6.283185307179586;
      }
    }
    *xll = dVar16 + *xll;
    *omgasm = -dVar5 * *xnodes +
              ((-(dVar15 * dVar3) * dVar6 + dVar16 + dVar17 + dVar5 * dVar2 + dVar20 + dVar1) - *xll
              );
  }
  else {
    *omgasm = (dVar17 - (dVar5 * dVar18) / dVar6) + *omgasm;
    *xnodes = dVar18 / dVar6 + *xnodes;
    *xll = dVar16 + *xll;
  }
  return;
}

Assistant:

void SGP4::DeepSpacePeriodics(
        const double tsince,
        const DeepSpaceConstants& ds_constants,
        double& em,
        double& xinc,
        double& omgasm,
        double& xnodes,
        double& xll)
{
    static const double ZES = 0.01675;
    static const double ZNS = 1.19459E-5;
    static const double ZNL = 1.5835218E-4;
    static const double ZEL = 0.05490;

    // calculate solar terms for time tsince
    double zm = ds_constants.zmos + ZNS * tsince;
    double zf = zm + 2.0 * ZES * sin(zm);
    double sinzf = sin(zf);
    double f2 = 0.5 * sinzf * sinzf - 0.25;
    double f3 = -0.5 * sinzf * cos(zf);

    const double ses = ds_constants.se2 * f2
        + ds_constants.se3 * f3;
    const double sis = ds_constants.si2 * f2
        + ds_constants.si3 * f3;
    const double sls = ds_constants.sl2 * f2
        + ds_constants.sl3 * f3
        + ds_constants.sl4 * sinzf;
    const double sghs = ds_constants.sgh2 * f2
        + ds_constants.sgh3 * f3
        + ds_constants.sgh4 * sinzf;
    const double shs = ds_constants.sh2 * f2
        + ds_constants.sh3 * f3;

    // calculate lunar terms for time tsince
    zm = ds_constants.zmol + ZNL * tsince;
    zf = zm + 2.0 * ZEL * sin(zm);
    sinzf = sin(zf);
    f2 = 0.5 * sinzf * sinzf - 0.25;
    f3 = -0.5 * sinzf * cos(zf);

    const double sel = ds_constants.ee2 * f2
        + ds_constants.e3 * f3;
    const double sil = ds_constants.xi2 * f2
        + ds_constants.xi3 * f3;
    const double sll = ds_constants.xl2 * f2
        + ds_constants.xl3 * f3
        + ds_constants.xl4 * sinzf;
    const double sghl = ds_constants.xgh2 * f2
        + ds_constants.xgh3 * f3
        + ds_constants.xgh4 * sinzf;
    const double shl = ds_constants.xh2 * f2
        + ds_constants.xh3 * f3;

    // merge calculated values
    const double pe = ses + sel;
    const double pinc = sis + sil;
    const double pl = sls + sll;
    const double pgh = sghs + sghl;
    const double ph = shs + shl;

    xinc += pinc;
    em += pe;

    /* Spacetrack report #3 has sin/cos from before perturbations
     * added to xinc (oldxinc), but apparently report # 6 has then
     * from after they are added.
     * use for strn3
     * if (elements_.Inclination() >= 0.2)
     * use for gsfc
     * if (xinc >= 0.2)
     * (moved from start of function)
     */
    const double sinis = sin(xinc);
    const double cosis = cos(xinc);

    if (xinc >= 0.2)
    {
        // apply periodics directly
        omgasm += pgh - cosis * ph / sinis;
        xnodes += ph / sinis;
        xll += pl;
    }
    else
    {
        // apply periodics with lyddane modification
        const double sinok = sin(xnodes);
        const double cosok = cos(xnodes);
        double alfdp = sinis * sinok;
        double betdp = sinis * cosok;
        const double dalf = ph * cosok + pinc * cosis * sinok;
        const double dbet = -ph * sinok + pinc * cosis * cosok;
        alfdp += dalf;
        betdp += dbet;
        xnodes = Util::WrapTwoPI(xnodes);
        double xls = xll + omgasm + cosis * xnodes;
        double dls = pl + pgh - pinc * xnodes * sinis;
        xls += dls;
        const double oldxnodes = xnodes;
        xnodes = atan2(alfdp, betdp);
        /**
         * Get perturbed xnodes in to same quadrant as original.
         * RAAN is in the range of 0 to 360 degrees
         * atan2 is in the range of -180 to 180 degrees
         */
        if (fabs(oldxnodes - xnodes) > kPI)
        {
            if (xnodes < oldxnodes)
            {
                xnodes += kTWOPI;
            }
            else
            {
                xnodes -= kTWOPI;
            }
        }

        xll += pl;
        omgasm = xls - xll - cosis * xnodes;
    }
}